

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O0

char * emulator_get_log_system_name(LogSystem system)

{
  char *pcStack_10;
  LogSystem system_local;
  
  switch(system) {
  case LOG_SYSTEM_A:
    pcStack_10 = "apu";
    break;
  case LOG_SYSTEM_H:
    pcStack_10 = "host";
    break;
  case LOG_SYSTEM_I:
    pcStack_10 = "io";
    break;
  case LOG_SYSTEM_INTERRUPT:
    pcStack_10 = "interrupt";
    break;
  case LOG_SYSTEM_M:
    pcStack_10 = "memory";
    break;
  case LOG_SYSTEM_P:
    pcStack_10 = "ppu";
    break;
  default:
    pcStack_10 = "<unknown log system>";
  }
  return pcStack_10;
}

Assistant:

const char* emulator_get_log_system_name(LogSystem system) {
  switch (system) {
#define V(SHORT_NAME, name, NAME) \
  case LOG_SYSTEM_##NAME:         \
    return #name;
  FOREACH_LOG_SYSTEM(V)
#undef V
    default:
      return "<unknown log system>";
  }
}